

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inGt(Tokenizer *this,char ch)

{
  char ch_local;
  Tokenizer *this_local;
  
  if (ch == '>') {
    this->type = tt_dict_close;
    this->state = st_token_ready;
  }
  else {
    this->type = tt_bad;
    QTC::TC("qpdf","QPDFTokenizer bad >",0);
    std::__cxx11::string::operator=((string *)&this->error_message,"unexpected >");
    this->in_token = false;
    this->char_to_unread = ch;
    this->state = st_token_ready;
  }
  return;
}

Assistant:

void
Tokenizer::inGt(char ch)
{
    if (ch == '>') {
        type = tt::tt_dict_close;
        state = st_token_ready;
    } else {
        type = tt::tt_bad;
        QTC::TC("qpdf", "QPDFTokenizer bad >");
        error_message = "unexpected >";
        in_token = false;
        char_to_unread = ch;
        state = st_token_ready;
    }
}